

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *I,Float scale,Image *im,RGBColorSpace *imageColorSpace,Allocator alloc)

{
  Allocator alloc_00;
  Bounds2f domain_00;
  int iVar1;
  char *fmt;
  Array2D<float> *data;
  size_t sVar2;
  size_t sVar3;
  Tuple2<pbrt::Point2,_float> in_RCX;
  char *in_RDI;
  Tuple2<pbrt::Point2,_float> args_1;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_stack_00000008;
  Array2D<float> d;
  anon_class_1_0_00000001 dpdA;
  Bounds2f domain;
  int vb;
  int va;
  PiecewiseConstant2D *in_stack_fffffffffffffdf8;
  PiecewiseConstant2D *in_stack_fffffffffffffe00;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe08;
  Image *in_stack_fffffffffffffe10;
  DenselySampledSpectrum *in_stack_fffffffffffffe18;
  Allocator in_stack_fffffffffffffe20;
  Image *in_stack_fffffffffffffe28;
  Allocator in_stack_fffffffffffffe30;
  PiecewiseConstant2D *this_00;
  undefined4 in_stack_fffffffffffffe40;
  int line;
  LogLevel level;
  char (*in_stack_fffffffffffffe80) [2];
  int *in_stack_fffffffffffffe88;
  char (*in_stack_fffffffffffffe90) [18];
  int *in_stack_fffffffffffffe98;
  Bounds2f *in_stack_fffffffffffffea0;
  function<float_(pbrt::Point2<float>)> *in_stack_fffffffffffffea8;
  Image *in_stack_fffffffffffffeb0;
  Allocator in_stack_fffffffffffffeb8;
  PiecewiseConstant2D local_d8;
  Float local_50;
  Float FStack_4c;
  undefined1 local_48 [8];
  undefined8 local_40;
  undefined4 local_2c;
  Float local_8;
  Float FStack_4;
  
  level = (LogLevel)((ulong)in_R8 >> 0x20);
  _local_8 = in_stack_00000008;
  local_40 = in_R9;
  local_2c = in_XMM0_Da;
  LightBase::LightBase
            ((LightBase *)in_stack_fffffffffffffe10,
             (LightType)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (Transform *)in_stack_fffffffffffffe00,(MediumInterface *)in_stack_fffffffffffffdf8);
  fmt = in_RDI + 0x98;
  line = (int)((ulong)local_48 >> 0x20);
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_fffffffffffffe00,(SpectrumHandle *)in_stack_fffffffffffffdf8
            );
  local_50 = local_8;
  FStack_4c = FStack_4;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_stack_fffffffffffffe18,(SpectrumHandle *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe20);
  *(undefined4 *)(in_RDI + 0xc0) = local_2c;
  Image::Image((Image *)in_stack_fffffffffffffe30.memoryResource,in_stack_fffffffffffffe28);
  *(undefined8 *)(in_RDI + 0x1e0) = local_40;
  WrapMode2D::WrapMode2D
            ((WrapMode2D *)in_stack_fffffffffffffe10,
             (WrapMode)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             (WrapMode)in_stack_fffffffffffffe08);
  args_1 = (Tuple2<pbrt::Point2,_float>)((long)in_RDI + 0x1f0);
  local_d8.pMarginal.min = local_8;
  local_d8.pMarginal.max = FStack_4;
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
  local_d8.pMarginal.cdf.nStored._4_4_ = 1;
  iVar1 = Image::NChannels((Image *)0x6edfb4);
  local_d8.pMarginal.cdf.nStored._0_4_ = iVar1;
  if (local_d8.pMarginal.cdf.nStored._4_4_ != iVar1) {
    LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
              (level,in_RDI,line,fmt,(char (*) [2])in_RCX,(char (*) [18])args_1,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe98);
  }
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffe00,
             (float)((ulong)in_stack_fffffffffffffdf8 >> 0x20),SUB84(in_stack_fffffffffffffdf8,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffe00,
             (float)((ulong)in_stack_fffffffffffffdf8 >> 0x20),SUB84(in_stack_fffffffffffffdf8,0));
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffffe10,(Point2<float> *)in_stack_fffffffffffffe08,
             (Point2<float> *)in_stack_fffffffffffffe00);
  data = (Array2D<float> *)(in_RDI + 200);
  this_00 = &local_d8;
  std::function<float(pbrt::Point2<float>)>::
  function<pbrt::GoniometricLight::GoniometricLight(pbrt::Transform_const&,pbrt::MediumInterface_const&,pbrt::SpectrumHandle,float,pbrt::Image,pbrt::RGBColorSpace_const*,pstd::pmr::polymorphic_allocator<std::byte>)::__0&,void>
            ((function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe00);
  Image::GetSamplingDistribution
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffeb8);
  std::function<float_(pbrt::Point2<float>)>::~function
            ((function<float_(pbrt::Point2<float>)> *)0x6ee139);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe00);
  domain_00.pMax.super_Tuple2<pbrt::Point2,_float> = in_RCX;
  domain_00.pMin.super_Tuple2<pbrt::Point2,_float> = args_1;
  alloc_00.memoryResource._4_4_ = iVar1;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffe40;
  PiecewiseConstant2D::PiecewiseConstant2D(this_00,data,domain_00,alloc_00);
  PiecewiseConstant2D::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  PiecewiseConstant2D::~PiecewiseConstant2D(in_stack_fffffffffffffe00);
  sVar2 = Image::BytesUsed(in_stack_fffffffffffffe10);
  sVar3 = PiecewiseConstant2D::BytesUsed((PiecewiseConstant2D *)in_stack_fffffffffffffe10);
  *(long *)(*in_FS_OFFSET + -0x3a0) = sVar2 + sVar3 + *(long *)(*in_FS_OFFSET + -0x3a0);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle I, Float scale, Image im,
                                   const RGBColorSpace *imageColorSpace, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      I(I, alloc),
      scale(scale),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      wrapMode(WrapMode::Repeat, WrapMode::Clamp),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    // Compute sampling distribution for _GoniometricLight_
    Bounds2f domain(Point2f(0, 0), Point2f(2 * Pi, Pi));
    auto dpdA = [](const Point2f &p) { return std::sin(p.y); };
    Array2D<Float> d = image.GetSamplingDistribution(dpdA, domain);
    distrib = PiecewiseConstant2D(d, domain);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}